

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O2

void DoReadyWeaponToSwitch(AActor *self,bool switchable)

{
  player_t *ppVar1;
  ushort uVar2;
  
  if ((self != (AActor *)0x0) && (ppVar1 = self->player, ppVar1 != (player_t *)0x0)) {
    uVar2 = ppVar1->WeaponState & 0xff7f;
    if (switchable) {
      uVar2 = ppVar1->WeaponState | 0x88;
    }
    ppVar1->WeaponState = uVar2;
  }
  return;
}

Assistant:

void DoReadyWeaponToSwitch (AActor *self, bool switchable)
{
	// Prepare for switching action.
	player_t *player;
	if (self && (player = self->player))
	{
		if (switchable)
		{
			player->WeaponState |= WF_WEAPONSWITCHOK | WF_REFIRESWITCHOK;
		}
		else
		{
			// WF_WEAPONSWITCHOK is automatically cleared every tic by P_SetPsprite().
			player->WeaponState &= ~WF_REFIRESWITCHOK;
		}
	}
}